

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O2

void __thiscall
bssl::ParseNameConstraints_IPAddressesNetmaskPermitPrefixLen31_Test::
~ParseNameConstraints_IPAddressesNetmaskPermitPrefixLen31_Test
          (ParseNameConstraints_IPAddressesNetmaskPermitPrefixLen31_Test *this)

{
  ~ParseNameConstraints_IPAddressesNetmaskPermitPrefixLen31_Test
            ((ParseNameConstraints_IPAddressesNetmaskPermitPrefixLen31_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, IPAddressesNetmaskPermitPrefixLen31) {
  std::string a;
  ASSERT_TRUE(LoadTestNameConstraint("ipaddress-permit_prefix31.pem", &a));

  CertErrors errors;
  std::unique_ptr<NameConstraints> name_constraints(
      NameConstraints::Create(StringAsBytes(a), is_critical(), &errors));
  ASSERT_TRUE(name_constraints);

  EXPECT_FALSE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(0, 0, 0, 0))));
  EXPECT_FALSE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(192, 168, 1, 1))));
  EXPECT_TRUE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(192, 168, 1, 2))));
  EXPECT_TRUE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(192, 168, 1, 3))));
  EXPECT_FALSE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(192, 168, 1, 4))));
  EXPECT_FALSE(
      name_constraints->IsPermittedIP(der::Input(IPAddress(192, 168, 1, 5))));
  EXPECT_FALSE(name_constraints->IsPermittedIP(
      der::Input(IPAddress(255, 255, 255, 255))));
}